

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O0

int loadScript(char *filePath,long uline,void *thunk,
              _func_int_char_ptr_long_int_ptr_void_ptr *evalFunc)

{
  kbool_t kVar1;
  int iVar2;
  undefined4 uVar3;
  FILE *__stream;
  char *t;
  kfileline_t kVar4;
  code *in_RCX;
  undefined8 in_RDX;
  kfileline_t in_RSI;
  char *in_RDI;
  int isBreak;
  char *script;
  char *in_stack_00000018;
  khalfword_t sline;
  kfileline_t rangeheadline;
  SimpleBuffer simpleBuffer;
  FILE *fp;
  int isSuccessfullyLoading;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int local_2c;
  kfileline_t local_18;
  int local_4;
  
  local_2c = 0;
  kVar1 = isDir(in_stack_00000018);
  if (kVar1) {
    local_4 = 0;
  }
  else {
    __stream = fopen(in_RDI,"r");
    if (__stream != (FILE *)0x0) {
      t = (char *)malloc(0x1000);
      local_2c = 1;
      kVar4 = in_RSI;
      while (local_18 = kVar4, iVar2 = feof(__stream), iVar2 == 0) {
        uVar3 = (undefined4)local_18;
        memset(t,0,0x1000);
        kVar4 = readChunk((FILE *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                          (kfileline_t)in_stack_ffffffffffffff98,
                          (SimpleBuffer *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffff98 = t;
        iVar2 = isEmptyChunk(t,CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (iVar2 == 0) {
          iVar2 = 0;
          local_2c = (*in_RCX)(in_stack_ffffffffffffff98,local_18,&stack0xffffffffffffff94,in_RDX);
          if ((local_2c == 0) || (iVar2 != 0)) break;
          in_stack_ffffffffffffff94 = 0;
        }
      }
      free(t);
      fclose(__stream);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int loadScript(const char *filePath, long uline, void *thunk, int (*evalFunc)(const char*, long, int *, void *))
{
	int isSuccessfullyLoading = false;
	if(isDir(filePath)) {
		return isSuccessfullyLoading;
	}
	FILE *fp = fopen(filePath, "r");
	if(fp != NULL) {
		SimpleBuffer simpleBuffer;
		simpleBuffer.buffer = (char *)malloc(K_PAGESIZE);
		simpleBuffer.allocSize = K_PAGESIZE;
		isSuccessfullyLoading = true;
		while(!feof(fp)) {
			kfileline_t rangeheadline = uline;
			khalfword_t sline = (khalfword_t)uline;
			bzero(simpleBuffer.buffer, simpleBuffer.allocSize);
			simpleBuffer.size = 0;
			uline = readChunk(fp, uline, &simpleBuffer);
			const char *script = (const char *)simpleBuffer.buffer;
			if(sline == 1 && simpleBuffer.size > 2 && script[0] == '#' && script[1] == '!') {
				// fall through this line
				simpleBuffer.size = 0;
				//TODO: do we increment uline??
			}
			if(!isEmptyChunk(script, simpleBuffer.size)) {
				int isBreak = false;
				isSuccessfullyLoading = evalFunc(script, rangeheadline, &isBreak, thunk);
				if(!isSuccessfullyLoading|| isBreak) {
					break;
				}
			}
		}
		free(simpleBuffer.buffer);
		fclose(fp);
	}
	return isSuccessfullyLoading;
}